

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.c
# Opt level: O0

int http_parser_parse_url(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  ushort uVar1;
  char *buf_00;
  ushort *in_RCX;
  int in_EDX;
  ulong in_RSI;
  char *in_RDI;
  unsigned_long v;
  char *end;
  char *p_1;
  uint16_t len;
  uint16_t off;
  int found_at;
  http_parser_url_fields old_uf;
  http_parser_url_fields uf;
  char *p;
  state s;
  ulong local_60;
  char *local_50;
  int iVar2;
  uint uVar3;
  uint in_stack_ffffffffffffffc4;
  state local_2c;
  int local_4;
  
  iVar2 = 0;
  if (in_RSI == 0) {
    local_4 = 1;
  }
  else {
    *in_RCX = 0;
    in_RCX[1] = 0;
    local_2c = s_req_spaces_before_url;
    if (in_EDX != 0) {
      local_2c = s_req_server_start;
    }
    uVar3 = 7;
    for (buf_00 = in_RDI; buf_00 < in_RDI + in_RSI; buf_00 = buf_00 + 1) {
      local_2c = parse_url_char(local_2c,*buf_00);
      switch(local_2c) {
      case s_dead:
        return 1;
      default:
        __assert_fail("!\"Unexpected state\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/third-party/url-parser/url_parser.c"
                      ,0x24d,
                      "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                     );
      case s_req_schema:
        in_stack_ffffffffffffffc4 = 0;
        break;
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        goto LAB_00114331;
      case s_req_server_with_at:
        iVar2 = 1;
      case s_req_server:
        in_stack_ffffffffffffffc4 = 1;
        break;
      case s_req_path:
        in_stack_ffffffffffffffc4 = 3;
        break;
      case s_req_query_string:
        in_stack_ffffffffffffffc4 = 4;
        break;
      case s_req_fragment:
        in_stack_ffffffffffffffc4 = 5;
      }
      if (in_stack_ffffffffffffffc4 == uVar3) {
        in_RCX[(ulong)in_stack_ffffffffffffffc4 * 2 + 3] =
             in_RCX[(ulong)in_stack_ffffffffffffffc4 * 2 + 3] + 1;
      }
      else {
        in_RCX[(ulong)in_stack_ffffffffffffffc4 * 2 + 2] = (short)buf_00 - (short)in_RDI;
        in_RCX[(ulong)in_stack_ffffffffffffffc4 * 2 + 3] = 1;
        *in_RCX = *in_RCX | (ushort)(1 << (sbyte)in_stack_ffffffffffffffc4);
        uVar3 = in_stack_ffffffffffffffc4;
      }
LAB_00114331:
    }
    if (((*in_RCX & 1) == 0) || ((*in_RCX & 2) != 0)) {
      if (((*in_RCX & 2) == 0) ||
         (iVar2 = http_parse_host(buf_00,(http_parser_url *)
                                         CONCAT44(in_stack_ffffffffffffffc4,uVar3),iVar2),
         iVar2 == 0)) {
        if ((in_EDX == 0) || (*in_RCX == 6)) {
          if ((*in_RCX & 4) != 0) {
            uVar1 = in_RCX[6];
            if (in_RSI < (ulong)(long)(int)((uint)uVar1 + (uint)in_RCX[7])) {
              __assert_fail("off + len <= buflen && \"Port number overflow\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/third-party/url-parser/url_parser.c"
                            ,0x27c,
                            "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                           );
            }
            local_60 = 0;
            for (local_50 = in_RDI + (int)(uint)uVar1;
                local_50 < in_RDI + (long)(int)(uint)in_RCX[7] + (long)(int)(uint)uVar1;
                local_50 = local_50 + 1) {
              local_60 = (long)(*local_50 + -0x30) + local_60 * 10;
              if (0xffff < local_60) {
                return 1;
              }
            }
            in_RCX[1] = (ushort)local_60;
          }
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int
http_parser_parse_url(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  if (buflen == 0) {
    return 1;
  }

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* fall through */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = (uint16_t)(p - buf);
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & (1 << UF_SCHEMA)) &&
      (u->field_set & (1 << UF_HOST)) == 0) {
    return 1;
  }

  if (u->field_set & (1 << UF_HOST)) {
    if (http_parse_host(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    uint16_t off;
    uint16_t len;
    const char* p;
    const char* end;
    unsigned long v;

    off = u->field_data[UF_PORT].off;
    len = u->field_data[UF_PORT].len;
    end = buf + off + len;

    /* NOTE: The characters are already validated and are in the [0-9] range */
    assert(off + len <= buflen && "Port number overflow");
    v = 0;
    for (p = buf + off; p < end; p++) {
      v *= 10;
      v += *p - '0';

      /* Ports have a max value of 2^16 */
      if (v > 0xffff) {
        return 1;
      }
    }

    u->port = (uint16_t) v;
  }

  return 0;
}